

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void gl4cts::FunctionObject::pack<tcu::Matrix<double,_3,_2>_>::set
               (GLvoid *buffer,Matrix<double,_3,_2> *in)

{
  double *pdVar1;
  undefined4 local_28;
  GLint index;
  GLint row;
  GLint column;
  GLdouble *data;
  Matrix<double,_3,_2> *in_local;
  GLvoid *buffer_local;
  
  for (index = 0; index < 2; index = index + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pdVar1 = tcu::Matrix<double,_3,_2>::operator()(in,local_28,index);
      *(double *)((long)buffer + (long)(index * 3 + local_28) * 8) = *pdVar1;
    }
  }
  return;
}

Assistant:

static void set(glw::GLvoid* buffer, const tcu::Matrix<glw::GLdouble, Rows, Cols>& in)
	{
		glw::GLdouble* data = (glw::GLdouble*)buffer;

		for (glw::GLint column = 0; column < Cols; ++column)
		{
			for (glw::GLint row = 0; row < Rows; ++row)
			{
				glw::GLint index = column * Rows + row;

				data[index] = in(row, column);
			}
		}
	}